

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

void namelist2gui(char *name,t_namelist *namelist)

{
  ulong uVar1;
  void *old;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  size_t nbytes;
  
  nbytes = 0x100;
  old = getbytes(0x100);
  if (namelist == (t_namelist *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0x20;
    uVar4 = 0;
    do {
      pvVar2 = old;
      uVar1 = uVar3;
      if (uVar3 <= uVar4) {
        pvVar2 = resizebytes(old,uVar3 * 8,uVar3 * 8 + 0x100);
        uVar1 = uVar3 + 0x20;
        if (pvVar2 == (void *)0x0) break;
      }
      uVar3 = uVar1;
      *(char **)((long)pvVar2 + uVar4 * 8) = namelist->nl_string;
      namelist = namelist->nl_next;
      uVar4 = uVar4 + 1;
      old = pvVar2;
    } while (namelist != (_namelist *)0x0);
    nbytes = uVar3 << 3;
  }
  pdgui_vmess("set","rS",name,uVar4 & 0xffffffff,old);
  freebytes(old,nbytes);
  return;
}

Assistant:

static void namelist2gui(const char*name, t_namelist*namelist)
{
    const size_t allocchunk = 32;
    int i;
    t_namelist *nl;

    size_t namesize = allocchunk;
    const char**names=(const char**)getbytes(namesize*sizeof(const char*));

    for (nl = namelist, i = 0; nl; nl = nl->nl_next, i++)
    {
        if(i>=namesize) {
            size_t newsize = namesize + allocchunk;
            const char**newnames = (const char**)resizebytes(
                names,
                namesize*sizeof(const char*),
                newsize*sizeof(const char*));
            if (!newnames)
                break;
            names = newnames;
            namesize = newsize;
        }
        names[i] = nl->nl_string;
    }
    pdgui_vmess("set", "rS",
              name,
              i, names);
    freebytes(names, namesize*sizeof(const char*));
}